

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> __thiscall
capnp::_::BuilderArena::getSegmentsForOutput(BuilderArena *this)

{
  MultiSegmentState *pMVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  word *pwVar3;
  word *pwVar4;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar5;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *builder;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar6;
  uint uVar7;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar9;
  
  pMVar1 = (this->moreSegments).ptr.ptr;
  if (pMVar1 != (MultiSegmentState *)0x0) {
    pAVar2 = (pMVar1->forOutput).builder.ptr;
    AVar8.size_ = (long)(pMVar1->forOutput).builder.pos - (long)pAVar2 >> 4;
    pwVar3 = (this->segment0).super_SegmentReader.ptr.ptr;
    pwVar4 = (this->segment0).pos;
    pAVar2->ptr = pwVar3;
    pAVar2->size_ = (long)pwVar4 - (long)pwVar3 >> 3;
    pMVar1 = (this->moreSegments).ptr.ptr;
    pOVar6 = (pMVar1->builders).builder.ptr;
    pOVar5 = (pMVar1->builders).builder.pos;
    if (pOVar6 != pOVar5) {
      uVar7 = 1;
      do {
        pwVar3 = (pOVar6->ptr->super_SegmentReader).ptr.ptr;
        pwVar4 = pOVar6->ptr->pos;
        pAVar2[uVar7].ptr = pwVar3;
        pAVar2[uVar7].size_ = (long)pwVar4 - (long)pwVar3 >> 3;
        pOVar6 = pOVar6 + 1;
        uVar7 = uVar7 + 1;
      } while (pOVar6 != pOVar5);
    }
    AVar8.ptr = pAVar2;
    return AVar8;
  }
  if ((this->segment0).super_SegmentReader.arena != (Arena *)0x0) {
    pwVar3 = (this->segment0).super_SegmentReader.ptr.ptr;
    pwVar4 = (this->segment0).pos;
    (this->segment0ForOutput).ptr = pwVar3;
    (this->segment0ForOutput).size_ = (long)pwVar4 - (long)pwVar3 >> 3;
    AVar9.size_ = 1;
    AVar9.ptr = &this->segment0ForOutput;
    return AVar9;
  }
  return (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>)ZEXT816(0);
}

Assistant:

inline operator T*() { return ptr; }